

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

void __thiscall QScrollBar::mousePressEvent(QScrollBar *this,QMouseEvent *e)

{
  QBasicTimer *pQVar1;
  undefined8 uVar2;
  uint uVar3;
  QScrollBarPrivate *this_00;
  bool bVar4;
  int iVar5;
  SubControl SVar6;
  Representation RVar7;
  QStyle *pQVar8;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined8 *puVar13;
  int iVar14;
  QStyleOptionSlider *pQVar15;
  int iVar16;
  long in_FS_OFFSET;
  bool bVar17;
  byte bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double in_XMM1_Qa;
  undefined1 auVar22 [16];
  QStyleOptionSlider opt;
  QRect local_d8;
  QPointF local_c8;
  QStyleOptionSlider local_b8;
  long local_38;
  QPoint QVar9;
  
  bVar18 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if ((this_00->super_QAbstractSliderPrivate).repeatActionTimer.m_id != Invalid) {
    QScrollBarPrivate::stopRepeatAction(this_00);
  }
  pQVar8 = QWidget::style((QWidget *)this);
  iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,2,0,this,0);
  puVar13 = &DAT_006eba80;
  pQVar15 = &local_b8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar2 = *puVar13;
    (pQVar15->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar2;
    (pQVar15->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar2 >> 0x20);
    puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
    pQVar15 = (QStyleOptionSlider *)((long)pQVar15 + (ulong)bVar18 * -0x10 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_b8);
  local_b8.keyboardModifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)(e + 0x20);
  if (((this_00->super_QAbstractSliderPrivate).maximum !=
       *(int *)&(this_00->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) &&
     (uVar3 = *(uint *)(e + 0x40), (*(uint *)(e + 0x44) & ~uVar3) == 0)) {
    bVar17 = uVar3 != 1;
    bVar4 = uVar3 != 4;
    if (!bVar17) {
      bVar4 = bVar17;
    }
    if (iVar5 == 0) {
      bVar4 = bVar17;
    }
    if (!bVar4) {
      pQVar8 = QWidget::style((QWidget *)this);
      dVar19 = (double)QEventPoint::position();
      dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
      dVar20 = 2147483647.0;
      if (dVar19 <= 2147483647.0) {
        dVar20 = dVar19;
      }
      if (dVar20 <= -2147483648.0) {
        dVar20 = -2147483648.0;
      }
      in_XMM1_Qa = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                   in_XMM1_Qa;
      dVar19 = 2147483647.0;
      if (in_XMM1_Qa <= 2147483647.0) {
        dVar19 = in_XMM1_Qa;
      }
      if (dVar19 <= -2147483648.0) {
        dVar19 = -2147483648.0;
      }
      local_c8.xp = (qreal)CONCAT44((int)dVar19,(int)dVar20);
      SVar6 = (**(code **)(*(long *)pQVar8 + 0xd0))(pQVar8,2,&local_b8,&local_c8,this);
      this_00->pressedControl = SVar6;
      this_00->pointerOutsidePressedControl = false;
      pQVar8 = QWidget::style((QWidget *)this);
      auVar22 = (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,2,&local_b8,0x40,this);
      dVar21 = (double)QEventPoint::position();
      dVar21 = (double)((ulong)dVar21 & 0x8000000000000000 | 0x3fe0000000000000) + dVar21;
      dVar20 = 2147483647.0;
      if (dVar21 <= 2147483647.0) {
        dVar20 = dVar21;
      }
      if (dVar20 <= -2147483648.0) {
        dVar20 = -2147483648.0;
      }
      dVar19 = (double)((ulong)dVar19 & 0x8000000000000000 | 0x3fe0000000000000) + dVar19;
      dVar21 = 2147483647.0;
      if (dVar19 <= 2147483647.0) {
        dVar21 = dVar19;
      }
      if (dVar21 <= -2147483648.0) {
        dVar21 = -2147483648.0;
      }
      iVar14 = (int)dVar21;
      iVar16 = auVar22._4_4_;
      iVar11 = auVar22._0_4_;
      if ((this_00->super_QAbstractSliderPrivate).orientation == Horizontal) {
        lVar10 = (long)auVar22._8_4_ + (long)iVar11;
        iVar12 = (iVar11 - (int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1)) + (int)dVar20;
      }
      else {
        lVar10 = (auVar22._0_8_ >> 0x20) + (auVar22._8_8_ >> 0x20);
        iVar12 = (iVar16 - (int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1)) + iVar14;
      }
      iVar12 = QScrollBarPrivate::pixelPosToRangeValue(this_00,iVar12);
      (this_00->super_QAbstractSliderPrivate).pressValue = iVar12;
      SVar6 = this_00->pressedControl;
      if ((SVar6 == SC_ComboBoxArrow) || (SVar6 == SC_ComboBoxListBoxPopup)) {
        if ((iVar5 == 0) || (*(int *)(e + 0x40) != 4)) {
          pQVar8 = QWidget::style((QWidget *)this);
          iVar5 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x27,&local_b8,this,0);
          if ((iVar5 == 0) || (*(int *)(e + 0x40) != 1)) goto LAB_0047c98d;
        }
        iVar5 = *(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280);
        iVar14 = auVar22._12_4_ - iVar16;
        if (iVar5 == 1) {
          iVar14 = auVar22._8_4_ - iVar11;
        }
        local_c8.xp = (qreal)QEventPoint::position();
        local_c8.yp = dVar21;
        if (iVar5 == 1) {
          QVar9 = QPointF::toPoint(&local_c8);
          RVar7 = QVar9.xp.m_i;
        }
        else {
          QVar9 = QPointF::toPoint(&local_c8);
          RVar7 = QVar9.yp.m_i;
        }
        iVar11 = (iVar14 + 1) / 2;
        iVar5 = QScrollBarPrivate::pixelPosToRangeValue(this_00,RVar7.m_i - iVar11);
        QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar5);
        this_00->pressedControl = SC_ScrollBarSlider;
        this_00->clickOffset = iVar11;
      }
      else if (SVar6 == SC_ScrollBarSlider) {
        iVar5 = iVar14 - iVar16;
        if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) == 1)
        {
          iVar5 = (int)dVar20 - iVar11;
        }
        this_00->clickOffset = iVar5;
        this_00->snapBackPosition = (this_00->super_QAbstractSliderPrivate).position;
      }
LAB_0047c98d:
      local_c8.xp = -0.0;
      local_c8.yp = -0.0;
      QElapsedTimer::start();
      QScrollBarPrivate::activateControl(this_00,this_00->pressedControl,500);
      pQVar8 = QWidget::style((QWidget *)this);
      local_d8 = (QRect)(**(code **)(*(long *)pQVar8 + 0xd8))
                                  (pQVar8,2,&local_b8,this_00->pressedControl,this);
      QWidget::repaint((QWidget *)this,&local_d8);
      lVar10 = QElapsedTimer::elapsed();
      if ((499 < lVar10) &&
         (pQVar1 = &(this_00->super_QAbstractSliderPrivate).repeatActionTimer,
         pQVar1->m_id != Invalid)) {
        QBasicTimer::start(pQVar1,50000000,1,this);
      }
      if (this_00->pressedControl == SC_ScrollBarSlider) {
        QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,true);
      }
      goto LAB_0047c67f;
    }
  }
  e[0xc] = (QMouseEvent)0x0;
LAB_0047c67f:
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);

    if (d->repeatActionTimer.isActive())
        d->stopRepeatAction();

    bool midButtonAbsPos = style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition,
                                             nullptr, this);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.keyboardModifiers = e->modifiers();

    if (d->maximum == d->minimum // no range
        || (e->buttons() & (~e->button())) // another button was clicked before
        || !(e->button() == Qt::LeftButton || (midButtonAbsPos && e->button() == Qt::MiddleButton))) {
        e->ignore();
        return;
    }

    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
    d->pointerOutsidePressedControl = false;

    QRect sr = style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                       QStyle::SC_ScrollBarSlider, this);
    QPoint click = e->position().toPoint();
    QPoint pressValue = click - sr.center() + sr.topLeft();
    d->pressValue = d->orientation == Qt::Horizontal ? d->pixelPosToRangeValue(pressValue.x()) :
        d->pixelPosToRangeValue(pressValue.y());
    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        d->clickOffset = HORIZONTAL ? (click.x()-sr.x()) : (click.y()-sr.y());
        d->snapBackPosition = d->position;
    }

    if ((d->pressedControl == QStyle::SC_ScrollBarAddPage
          || d->pressedControl == QStyle::SC_ScrollBarSubPage)
        && ((midButtonAbsPos && e->button() == Qt::MiddleButton)
            || (style()->styleHint(QStyle::SH_ScrollBar_LeftClickAbsolutePosition, &opt, this)
                && e->button() == Qt::LeftButton))) {
        int sliderLength = HORIZONTAL ? sr.width() : sr.height();
        setSliderPosition(d->pixelPosToRangeValue((HORIZONTAL ? e->position().toPoint().x()
                                                              : e->position().toPoint().y()) - sliderLength / 2));
        d->pressedControl = QStyle::SC_ScrollBarSlider;
        d->clickOffset = sliderLength / 2;
    }
    const int initialDelay = 500; // default threshold
    QElapsedTimer time;
    time.start();
    d->activateControl(d->pressedControl, initialDelay);
    repaint(style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this));
    if (time.elapsed() >= initialDelay && d->repeatActionTimer.isActive()) {
        // It took more than 500ms (the initial timer delay) to process
        // the control activation and repaint(), we therefore need
        // to restart the timer in case we have a pending mouse release event;
        // otherwise we'll get a timer event right before the release event,
        // causing the repeat action to be invoked twice on a single mouse click.
        // 50ms is the default repeat time (see activateControl/setRepeatAction).
        d->repeatActionTimer.start(50, this);
    }
    if (d->pressedControl == QStyle::SC_ScrollBarSlider)
        setSliderDown(true);
}